

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-gear.c
# Opt level: O3

char * equip_mention(player *p,wchar_t slot)

{
  ushort uVar1;
  equip_slot *peVar2;
  char *pcVar3;
  
  peVar2 = (p->body).slots;
  uVar1 = peVar2[slot].type;
  if (((uVar1 != 1) ||
      ((pcVar3 = "just lifting", (p->state).heavy_wield == false &&
       ((p->state).heavy_shoot == false)))) &&
     (pcVar3 = slot_table[uVar1].mention, slot_table[uVar1].name_in_desc == true)) {
    pcVar3 = format(pcVar3,peVar2[slot].name);
    return pcVar3;
  }
  return pcVar3;
}

Assistant:

const char *equip_mention(struct player *p, int slot)
{
	int type = p->body.slots[slot].type;

	/* Heavy */
	if ((type == EQUIP_WEAPON && p->state.heavy_wield) ||
			(type == EQUIP_WEAPON && p->state.heavy_shoot))
		return slot_table[type].heavy_describe;
	else if (slot_table[type].name_in_desc)
		return format(slot_table[type].mention, p->body.slots[slot].name);
	else
		return slot_table[type].mention;
}